

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

int mfprintf(mFILE *mf,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  void *local_110;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  char *local_58;
  void *new_data;
  size_t new_alloced;
  va_list args;
  size_t est_length;
  int ret;
  char *fmt_local;
  mFILE *mf_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_108;
  args[0]._0_8_ = &stack0x00000008;
  new_alloced._4_4_ = 0x30;
  new_alloced._0_4_ = 0x10;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  iVar1 = vflen(fmt,(__va_list_tag *)&new_alloced);
  args[0].reg_save_area = (void *)(long)iVar1;
  while( true ) {
    if ((long)args[0].reg_save_area + mf->offset <= mf->alloced) {
      args[0].overflow_arg_area = local_108;
      args[0]._0_8_ = &stack0x00000008;
      new_alloced._4_4_ = 0x30;
      new_alloced._0_4_ = 0x10;
      mf_local._4_4_ = vsprintf(mf->data + mf->offset,fmt,&new_alloced);
      if ((0 < mf_local._4_4_) &&
         (mf->offset = (long)mf_local._4_4_ + mf->offset, mf->size < mf->offset)) {
        mf->size = mf->offset;
      }
      if ((mf->fp == _stderr) && (iVar1 = mfflush(mf), iVar1 != 0)) {
        mf_local._4_4_ = -1;
      }
      return mf_local._4_4_;
    }
    if (mf->alloced == 0) {
      local_110 = (void *)0x400;
    }
    else {
      local_110 = (void *)(mf->alloced << 1);
    }
    new_data = local_110;
    local_58 = (char *)realloc(mf->data,(size_t)local_110);
    if (local_58 == (char *)0x0) break;
    mf->alloced = (size_t)new_data;
    mf->data = local_58;
  }
  return -1;
}

Assistant:

int mfprintf(mFILE *mf, char *fmt, ...) {
    int ret;
    size_t est_length;
    va_list args;

    va_start(args, fmt);
    est_length = vflen(fmt, args);
    va_end(args);
    while (est_length + mf->offset > mf->alloced) {
	size_t new_alloced = mf->alloced ? mf->alloced * 2 : 1024;
	void * new_data    = realloc(mf->data, new_alloced);
	if (NULL == new_data) return -1;
	mf->alloced = new_alloced;
	mf->data    = new_data;
    }

    va_start(args, fmt);
    ret = vsprintf(&mf->data[mf->offset], fmt, args);
    va_end(args);

    if (ret > 0) {
	mf->offset += ret;
	if (mf->size < mf->offset)
	    mf->size = mf->offset;
    }

    if (mf->fp == stderr) {
	/* Auto-flush for stderr */
	if (0 != mfflush(mf)) return -1;
    }

    return ret;
}